

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# db_impl.cc
# Opt level: O0

Status __thiscall leveldb::DBImpl::Write(DBImpl *this,WriteOptions *options,WriteBatch *updates)

{
  Slice *slice;
  value_type this_00;
  int iVar1;
  reference ppWVar2;
  Mutex *in_RCX;
  bool bVar3;
  Writer *ready;
  Status local_d0;
  byte local_c1;
  undefined1 auStack_c0 [7];
  bool sync_error;
  undefined1 local_b0 [16];
  WriteBatch *write_batch;
  Writer *last_writer;
  uint64_t last_sequence;
  value_type local_88;
  MutexLock local_80;
  MutexLock l;
  Writer w;
  WriteBatch *updates_local;
  WriteOptions *options_local;
  DBImpl *this_local;
  Status *status;
  
  w.cv.mu_ = in_RCX;
  Writer::Writer((Writer *)&l,(Mutex *)(options + 200));
  w.status.state_ = (char *)w.cv.mu_;
  w.batch._0_1_ = (byte)(updates->rep_)._M_dataplus & 1;
  w.batch._1_1_ = 0;
  MutexLock::MutexLock(&local_80,(Mutex *)(options + 200));
  local_88 = (value_type)&l;
  std::deque<leveldb::DBImpl::Writer_*,_std::allocator<leveldb::DBImpl::Writer_*>_>::push_back
            ((deque<leveldb::DBImpl::Writer_*,_std::allocator<leveldb::DBImpl::Writer_*>_> *)
             (options + 0x168),&local_88);
  while( true ) {
    bVar3 = false;
    if ((w.batch._1_1_ & 1) == 0) {
      ppWVar2 = std::deque<leveldb::DBImpl::Writer_*,_std::allocator<leveldb::DBImpl::Writer_*>_>::
                front((deque<leveldb::DBImpl::Writer_*,_std::allocator<leveldb::DBImpl::Writer_*>_>
                       *)(options + 0x168));
      bVar3 = (value_type)&l != *ppWVar2;
    }
    if (!bVar3) break;
    port::CondVar::Wait((CondVar *)&w.sync);
  }
  if ((w.batch._1_1_ & 1) == 0) {
    last_sequence._3_1_ = 0;
    MakeRoomForWrite(this,SUB81(options,0));
    last_writer = (Writer *)VersionSet::LastSequence(*(VersionSet **)(options + 0x228));
    write_batch = (WriteBatch *)&l;
    bVar3 = Status::ok((Status *)this);
    if ((bVar3) && (w.cv.mu_ != (Mutex *)0x0)) {
      local_b0._8_8_ = BuildBatchGroup((DBImpl *)options,(Writer **)&write_batch);
      WriteBatchInternal::SetSequence
                ((WriteBatch *)local_b0._8_8_,
                 (SequenceNumber)((long)&(last_writer->status).state_ + 1));
      iVar1 = WriteBatchInternal::Count((WriteBatch *)local_b0._8_8_);
      last_writer = (Writer *)((long)&(last_writer->status).state_ + (long)iVar1);
      port::Mutex::Unlock((Mutex *)(options + 200));
      slice = *(Slice **)(options + 0x158);
      _auStack_c0 = WriteBatchInternal::Contents((WriteBatch *)local_b0._8_8_);
      log::Writer::AddRecord((Writer *)local_b0,slice);
      Status::operator=((Status *)this,(Status *)local_b0);
      Status::~Status((Status *)local_b0);
      local_c1 = 0;
      bVar3 = Status::ok((Status *)this);
      if ((bVar3) && (((byte)(updates->rep_)._M_dataplus & 1) != 0)) {
        (**(code **)(**(long **)(options + 0x148) + 0x28))(&local_d0);
        Status::operator=((Status *)this,&local_d0);
        Status::~Status(&local_d0);
        bVar3 = Status::ok((Status *)this);
        if (!bVar3) {
          local_c1 = 1;
        }
      }
      bVar3 = Status::ok((Status *)this);
      if (bVar3) {
        WriteBatchInternal::InsertInto
                  ((WriteBatchInternal *)&ready,(WriteBatch *)local_b0._8_8_,
                   *(MemTable **)(options + 0x130));
        Status::operator=((Status *)this,(Status *)&ready);
        Status::~Status((Status *)&ready);
      }
      port::Mutex::Lock((Mutex *)(options + 200));
      if ((local_c1 & 1) != 0) {
        RecordBackgroundError((DBImpl *)options,(Status *)this);
      }
      if ((WriteBatch *)local_b0._8_8_ == *(WriteBatch **)(options + 0x1b8)) {
        WriteBatch::Clear(*(WriteBatch **)(options + 0x1b8));
      }
      VersionSet::SetLastSequence(*(VersionSet **)(options + 0x228),(uint64_t)last_writer);
    }
    do {
      ppWVar2 = std::deque<leveldb::DBImpl::Writer_*,_std::allocator<leveldb::DBImpl::Writer_*>_>::
                front((deque<leveldb::DBImpl::Writer_*,_std::allocator<leveldb::DBImpl::Writer_*>_>
                       *)(options + 0x168));
      this_00 = *ppWVar2;
      std::deque<leveldb::DBImpl::Writer_*,_std::allocator<leveldb::DBImpl::Writer_*>_>::pop_front
                ((deque<leveldb::DBImpl::Writer_*,_std::allocator<leveldb::DBImpl::Writer_*>_> *)
                 (options + 0x168));
      if (this_00 != (value_type)&l) {
        Status::operator=(&this_00->status,(Status *)this);
        this_00->done = true;
        port::CondVar::Signal(&this_00->cv);
      }
    } while (this_00 != (value_type)write_batch);
    bVar3 = std::deque<leveldb::DBImpl::Writer_*,_std::allocator<leveldb::DBImpl::Writer_*>_>::empty
                      ((deque<leveldb::DBImpl::Writer_*,_std::allocator<leveldb::DBImpl::Writer_*>_>
                        *)(options + 0x168));
    if (!bVar3) {
      ppWVar2 = std::deque<leveldb::DBImpl::Writer_*,_std::allocator<leveldb::DBImpl::Writer_*>_>::
                front((deque<leveldb::DBImpl::Writer_*,_std::allocator<leveldb::DBImpl::Writer_*>_>
                       *)(options + 0x168));
      port::CondVar::Signal(&(*ppWVar2)->cv);
    }
    last_sequence._3_1_ = 1;
  }
  else {
    Status::Status((Status *)this,(Status *)&l);
  }
  last_sequence._4_4_ = 1;
  MutexLock::~MutexLock(&local_80);
  Writer::~Writer((Writer *)&l);
  return (Status)(char *)this;
}

Assistant:

Status DBImpl::Write(const WriteOptions& options, WriteBatch* updates) {
  Writer w(&mutex_);
  w.batch = updates;
  w.sync = options.sync;
  w.done = false;

  //LevelDB加锁保证同一时刻只能有一个Writer工作。其他Writer挂起等待，直到前一个Writer执行完毕后唤醒。
  MutexLock l(&mutex_);
  writers_.push_back(&w);
  while (!w.done && &w != writers_.front()) {
    w.cv.Wait();
  }
  if (w.done) {
    return w.status;
  }

  // May temporarily unlock and wait.
  Status status = MakeRoomForWrite(updates == nullptr);//做一些写入前的check，包括如是不是该停写，是不是该切memtable，是不是该compact等
  uint64_t last_sequence = versions_->LastSequence();//获取最大的序列号
  Writer* last_writer = &w;// laster_writer的意思是打包多个write中的最后一个writer
  if (status.ok() && updates != nullptr) {  // nullptr batch is for compactions
    WriteBatch* write_batch = BuildBatchGroup(&last_writer);//这个函数要拿出来，重点说一下
    // 这里要联系到上边的 MutexLock l(&mutex_); 下边的那段代码：
    // 合并writers里多个writer的WriteBatch，就是上面write deque里阻塞住的writer完成他们的任务
    // 第一个进来的写操作会在真正写log文件和写memtable时候把锁放掉，
    // 这时候别的写操作会进来把自己push到writes_的deque中，然后挂起在自己的条件锁上（ w.cv.Wait();）
    // 为什么呢？因为此时自己的done不是true并且自己不是deque中的第一个writer，
    // 等第一个writer全部操作完之后呢，会把此时deque中的所有writer唤醒,为什么醒了之后第一步是判断自己是不是done呢，自己还没执行怎么可能会done呢
    // 其实这就是leveldb的优化，当前抢到锁进来的writer会在真正操作之前把此时deque中所有的writer的任务都拿过来（实际上不是全拿过来，有数量限制），
    // 然后帮他们都做了，并且把结果放回至每个writer对应的status中，最后再唤醒所有writer，所以这些writer醒来后发现自己的任务已经被做了，就直接拿自己的返回值返回了

    WriteBatchInternal::SetSequence(write_batch, last_sequence + 1);//本次写入对应的序列号
    last_sequence += WriteBatchInternal::Count(write_batch);//更新last_sequence，加的个数等于此次是WriteBatch中操作的个数

    // Add to log and apply to memtable.  We can release the lock
    // during this phase since &w is currently responsible for logging
    // and protects against concurrent loggers and concurrent writes
    // into mem_.
    {
      mutex_.Unlock();//写log和写memtable时可以放锁，让别的write进入deque，以减少互斥时间
      status = log_->AddRecord(WriteBatchInternal::Contents(write_batch));
      bool sync_error = false;
      if (status.ok() && options.sync) {
        status = logfile_->Sync();
        if (!status.ok()) {
          sync_error = true;
        }
      }
      if (status.ok()) {
        status = WriteBatchInternal::InsertInto(write_batch, mem_);
      }
      mutex_.Lock();//再次加锁，互斥的更新versions的last_sequence
      if (sync_error) {
        // The state of the log file is indeterminate: the log record we
        // just added may or may not show up when the DB is re-opened.
        // So we force the DB into a mode where all future writes fail.
        RecordBackgroundError(status);
      }
    }
    if (write_batch == tmp_batch_) tmp_batch_->Clear();

    versions_->SetLastSequence(last_sequence);
  }

  //从deque的第一个writer开始pop，第一个writer一定是当前操作的writer，
  //直到pop到本次打包的最后一个writer
  while (true) {
    Writer* ready = writers_.front();
    writers_.pop_front();
    if (ready != &w) {
      ready->status = status;
      ready->done = true;
      ready->cv.Signal();
    }
    if (ready == last_writer) break;
  }

  // Notify new head of write queue
  //唤醒此时的deque头writer，从它开始进行接下来的写入
  if (!writers_.empty()) {
    writers_.front()->cv.Signal();
  }

  return status;
}